

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O1

int ncnn::from_gray2rgb(uchar *gray,int w,int h,int stride,Mat *m,Allocator *allocator)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  void *pvVar5;
  void *pvVar6;
  int iVar7;
  long lVar8;
  
  Mat::create(m,w,h,3,4,allocator);
  pvVar1 = m->data;
  if ((pvVar1 != (void *)0x0) && ((long)m->c * m->cstep != 0)) {
    iVar2 = 1;
    if (stride - w == 0) {
      iVar2 = h;
      h = 1;
    }
    if (0 < h) {
      lVar4 = m->elemsize * m->cstep;
      pvVar6 = (void *)((long)m->data + lVar4 * 2);
      pvVar5 = (void *)(lVar4 + (long)m->data);
      iVar7 = 0;
      do {
        if (0 < iVar2 * w) {
          lVar8 = 0;
          lVar4 = 0;
          iVar3 = iVar2 * w + 1;
          do {
            *(float *)((long)pvVar1 + lVar4 * 4) = (float)gray[lVar4];
            *(float *)((long)pvVar5 + lVar4 * 4) = (float)gray[lVar4];
            *(float *)((long)pvVar6 + lVar4 * 4) = (float)gray[lVar4];
            iVar3 = iVar3 + -1;
            lVar4 = lVar4 + 1;
            lVar8 = lVar8 + -4;
          } while (1 < iVar3);
          pvVar6 = (void *)((long)pvVar6 - lVar8);
          pvVar5 = (void *)((long)pvVar5 - lVar8);
          pvVar1 = (void *)((long)pvVar1 - lVar8);
          gray = gray + lVar4;
        }
        gray = gray + (stride - w);
        iVar7 = iVar7 + 1;
      } while (iVar7 != h);
    }
  }
  return (int)pvVar1;
}

Assistant:

static int from_gray2rgb(const unsigned char* gray, int w, int h, int stride, Mat& m, Allocator* allocator)
{
    m.create(w, h, 3, 4u, allocator);
    if (m.empty())
        return -100;

    const int wgap = stride - w;
    if (wgap == 0)
    {
        w = w * h;
        h = 1;
    }

    float* ptr0 = m.channel(0);
    float* ptr1 = m.channel(1);
    float* ptr2 = m.channel(2);

    for (int y=0; y<h; y++)
    {
#if __ARM_NEON
        int nn = w >> 4;
        int remain = w - (nn << 4);
#else
        int remain = w;
#endif // __ARM_NEON

#if __ARM_NEON
#if __aarch64__
        for (; nn>0; nn--)
        {
            uint8x16_t _gray = vld1q_u8(gray);
            uint16x8_t _gray16_0 = vmovl_u8(vget_low_u8(_gray));
            uint16x8_t _gray16_1 = vmovl_u8(vget_high_u8(_gray));

            float32x4_t _graylow_0 = vcvtq_f32_u32(vmovl_u16(vget_low_u16(_gray16_0)));
            float32x4_t _grayhigh_0 = vcvtq_f32_u32(vmovl_u16(vget_high_u16(_gray16_0)));
            float32x4_t _graylow_1 = vcvtq_f32_u32(vmovl_u16(vget_low_u16(_gray16_1)));
            float32x4_t _grayhigh_1 = vcvtq_f32_u32(vmovl_u16(vget_high_u16(_gray16_1)));

            vst1q_f32(ptr0, _graylow_0);
            vst1q_f32(ptr0+4, _grayhigh_0);
            vst1q_f32(ptr0+8, _graylow_1);
            vst1q_f32(ptr0+12, _grayhigh_1);

            vst1q_f32(ptr1, _graylow_0);
            vst1q_f32(ptr1+4, _grayhigh_0);
            vst1q_f32(ptr1+8, _graylow_1);
            vst1q_f32(ptr1+12, _grayhigh_1);

            vst1q_f32(ptr2, _graylow_0);
            vst1q_f32(ptr2+4, _grayhigh_0);
            vst1q_f32(ptr2+8, _graylow_1);
            vst1q_f32(ptr2+12, _grayhigh_1);

            gray += 16;
            ptr0 += 16;
            ptr1 += 16;
            ptr2 += 16;
        }
#else
        if (nn > 0)
        {
        asm volatile(
            "0:                             \n"
            "pld        [%1, #128]          \n"
            "vld1.u8    {d0,d1}, [%1]!      \n"
            "vmovl.u8   q8, d0              \n"
            "vmovl.u8   q9, d1              \n"
            "vmovl.u16  q0, d16             \n"
            "vmovl.u16  q1, d17             \n"
            "vmovl.u16  q2, d18             \n"
            "vmovl.u16  q3, d19             \n"
            "vcvt.f32.u32   q0, q0          \n"
            "vcvt.f32.u32   q1, q1          \n"
            "vcvt.f32.u32   q2, q2          \n"
            "vcvt.f32.u32   q3, q3          \n"
            "subs       %0, #1              \n"
            "vst1.f32   {d0-d3}, [%2 :128]! \n"
            "vst1.f32   {d4-d7}, [%2 :128]! \n"
            "vst1.f32   {d0-d3}, [%3 :128]! \n"
            "vst1.f32   {d4-d7}, [%3 :128]! \n"
            "vst1.f32   {d0-d3}, [%4 :128]! \n"
            "vst1.f32   {d4-d7}, [%4 :128]! \n"
            "bne        0b                  \n"
            : "=r"(nn),     // %0
              "=r"(gray),   // %1
              "=r"(ptr0),   // %2
              "=r"(ptr1),   // %3
              "=r"(ptr2)    // %4
            : "0"(nn),
              "1"(gray),
              "2"(ptr0),
              "3"(ptr1),
              "4"(ptr2)
            : "cc", "memory", "q0", "q1", "q2", "q3", "q8", "q9"
        );
        }
#endif // __aarch64__
#endif // __ARM_NEON
        for (; remain>0; remain--)
        {
            *ptr0 = *gray;
            *ptr1 = *gray;
            *ptr2 = *gray;

            gray++;
            ptr0++;
            ptr1++;
            ptr2++;
        }

        gray += wgap;
    }

    return 0;
}